

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O1

void show_project_cb(Fl_Widget *param_1,void *param_2)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  
  if (project_window == (Fl_Double_Window *)0x0) {
    make_project_window();
  }
  Fl_Button::value((Fl_Button *)include_H_from_C_button,include_H_from_C);
  Fl_Button::value((Fl_Button *)use_FL_COMMAND_button,use_FL_COMMAND);
  Fl_Input_::value(&header_file_input->super_Fl_Input_,header_file_name);
  Fl_Input_::value(&code_file_input->super_Fl_Input_,code_file_name);
  Fl_Choice::value(i18n_type_chooser,i18n_type);
  Fl_Input_::value(&i18n_function_input->super_Fl_Input_,i18n_function);
  Fl_Input_::value(&i18n_file_input->super_Fl_Input_,i18n_file);
  Fl_Input_::value((Fl_Input_ *)i18n_set_input,i18n_set);
  Fl_Input_::value(&i18n_include_input->super_Fl_Input_,i18n_include);
  uVar3 = (ulong)(uint)i18n_type;
  if (uVar3 < 3) {
    lVar1 = *(long *)(&DAT_002141f8 + uVar3 * 8);
    lVar2 = *(long *)(&DAT_00214210 + uVar3 * 8);
    (**(code **)((long)(i18n_include_input->super_Fl_Input_).super_Fl_Widget._vptr_Fl_Widget +
                *(long *)(&DAT_002141e0 + uVar3 * 8)))();
    (**(code **)((long)(i18n_file_input->super_Fl_Input_).super_Fl_Widget._vptr_Fl_Widget + lVar1))
              ();
    (**(code **)((long)(i18n_set_input->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.
                       _vptr_Fl_Widget + lVar1))();
    (**(code **)((long)(i18n_function_input->super_Fl_Input_).super_Fl_Widget._vptr_Fl_Widget +
                lVar2))();
  }
  Fl_Window::hotspot(&project_window->super_Fl_Window,(Fl_Widget *)project_window,0);
  (*(project_window->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[5])();
  return;
}

Assistant:

void show_project_cb(Fl_Widget *, void *) {
  if(project_window==0) make_project_window();
  include_H_from_C_button->value(include_H_from_C);
  use_FL_COMMAND_button->value(use_FL_COMMAND);
  header_file_input->value(header_file_name);
  code_file_input->value(code_file_name);
  i18n_type_chooser->value(i18n_type);
  i18n_function_input->value(i18n_function);
  i18n_file_input->value(i18n_file);
  i18n_set_input->value(i18n_set);
  i18n_include_input->value(i18n_include);
  switch (i18n_type) {
  case 0 : /* None */
      i18n_include_input->hide();
      i18n_file_input->hide();
      i18n_set_input->hide();
      i18n_function_input->hide();
      break;
  case 1 : /* GNU gettext */
      i18n_include_input->show();
      i18n_file_input->hide();
      i18n_set_input->hide();
      i18n_function_input->show();
      break;
  case 2 : /* POSIX cat */
      i18n_include_input->show();
      i18n_file_input->show();
      i18n_set_input->show();
      i18n_function_input->hide();
      break;
  }
  project_window->hotspot(project_window);
  project_window->show();
}